

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::View
          (View<int,_true,_std::allocator<unsigned_long>_> *this,pointer data,
          allocator_type *allocator)

{
  allocator<unsigned_long> local_21;
  allocator_type *local_20;
  allocator_type *allocator_local;
  pointer data_local;
  View<int,_true,_std::allocator<unsigned_long>_> *this_local;
  
  this->data_ = data;
  local_20 = allocator;
  allocator_local = (allocator_type *)data;
  data_local = (pointer)this;
  std::allocator<unsigned_long>::allocator<int>(&local_21,allocator);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
            (&this->geometry_,0,&defaultOrder,1,true,&local_21);
  std::allocator<unsigned_long>::~allocator(&local_21);
  testInvariant(this);
  return;
}

Assistant:

inline
View<T, isConst, A>::View
(
    pointer data,
    const allocator_type& allocator
)
: data_(data),
  geometry_(geometry_type(0, defaultOrder, 1, true, allocator))
{
    testInvariant();
}